

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O2

void __thiscall DCFGReader::buildCFG(DCFGReader *this,int entry)

{
  int iVar1;
  uint __line;
  _List_node_base *__k;
  mapped_type *pmVar2;
  CFG *this_00;
  CfgNode *pCVar3;
  CfgNode *pCVar4;
  iterator iVar5;
  BlockData *this_01;
  _List_node_base *p_Var6;
  iterator iVar7;
  CFG *pCVar8;
  char *__assertion;
  _List_node_base *count;
  _List_node_base *p_Var9;
  _Base_ptr addr;
  map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
  *this_02;
  int src_id;
  CfgNode *local_c0;
  int entry_local;
  DCFGReader *local_b0;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_a8;
  _Base_ptr local_a0;
  map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
  *local_98;
  map<int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>_>_>_>
  *local_90;
  mapped_type *local_88;
  _Base_ptr local_80;
  list<int,_std::allocator<int>_> worklist;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  
  this_02 = &this->m_nodes;
  entry_local = entry;
  pmVar2 = std::
           map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
           ::operator[](this_02,&entry_local);
  local_b0 = this;
  this_00 = CFGReader::instance(&this->super_CFGReader,pmVar2->addr);
  if (this_00->m_entryNode == (CfgNode *)0x0) {
    pCVar3 = (CfgNode *)operator_new(0x18);
    CfgNode::CfgNode(pCVar3,CFG_ENTRY);
    CFG::addNode(this_00,pCVar3);
    pmVar2 = std::
             map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
             ::operator[](this_02,&entry_local);
    pCVar4 = CFG::nodeByAddr(this_00,pmVar2->addr);
    if (pCVar4 == (CfgNode *)0x0) {
      pmVar2 = std::
               map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
               ::operator[](this_02,&entry_local);
      pCVar4 = CFGReader::nodeWithAddr(this_00,pmVar2->addr);
      CFG::addEdge(this_00,pCVar3,pCVar4,this_00->m_execs);
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &visited._M_t._M_impl.super__Rb_tree_header._M_header;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      worklist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
      _M_next = (_List_node_base *)&worklist;
      worklist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
      worklist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
      _M_prev = worklist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                super__List_node_base._M_next;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)
                 worklist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                 super__List_node_base._M_next,&entry_local);
      local_90 = &local_b0->m_edges;
      local_80 = &(local_b0->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_a8 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_b0->m_visited;
      local_a0 = &(local_b0->m_visited)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_98 = this_02;
LAB_0010bff8:
      do {
        if (worklist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
            super__List_node_base._M_next == (_List_node_base *)&worklist) {
          std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
                    (&worklist.super__List_base<int,_std::allocator<int>_>);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&visited._M_t);
          return;
        }
        src_id = *(int *)&worklist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                          super__List_node_base._M_next[1]._M_next;
        std::__cxx11::list<int,_std::allocator<int>_>::pop_front(&worklist);
        if (src_id < 4) {
          __assertion = "src_id > 3";
          __line = 0x54;
          goto LAB_0010c2bb;
        }
        iVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)&visited,&src_id);
      } while ((_Rb_tree_header *)iVar5._M_node != &visited._M_t._M_impl.super__Rb_tree_header);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &visited,&src_id);
      pmVar2 = std::
               map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
               ::operator[](this_02,&src_id);
      pCVar3 = CFG::nodeByAddr(this_00,pmVar2->addr);
      if ((pCVar3 != (CfgNode *)0x0) && (pCVar3->m_type == CFG_PHANTOM)) {
        this_01 = (BlockData *)operator_new(0x90);
        CfgNode::BlockData::BlockData(this_01,pmVar2->addr,pmVar2->size,false);
        CfgNode::setData(pCVar3,(Data *)this_01);
        local_c0 = pCVar3;
        local_88 = pmVar2;
        p_Var6 = (_List_node_base *)
                 std::
                 map<int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>_>_>_>
                 ::operator[](local_90,&src_id);
        p_Var9 = p_Var6;
LAB_0010c0b1:
        do {
          p_Var9 = (((_List_base<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_> *)
                    &p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var9 == p_Var6) goto LAB_0010c23a;
          if (*(int *)&p_Var9[1]._M_next != 3) {
            __k = p_Var9 + 1;
            iVar7 = std::
                    _Rb_tree<int,_std::pair<const_int,_DCFGReader::Node>,_std::_Select1st<std::pair<const_int,_DCFGReader::Node>_>,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
                    ::find(&local_98->_M_t,(key_type_conflict *)__k);
            if (iVar7._M_node == local_80) {
              addr = (_Base_ptr)0x0;
            }
            else {
              addr = iVar7._M_node[1]._M_parent;
            }
            iVar1 = *(int *)((long)&p_Var9[1]._M_next + 4);
            if (0x17 < iVar1 - 2U) {
switchD_0010c108_caseD_3:
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                            ,0x95,"void DCFGReader::buildCFG(int)");
            }
            count = p_Var9[1]._M_prev;
            switch(iVar1) {
            case 2:
              if (*(int *)&__k->_M_next != 2) {
                __assert_fail("edge.dst_id == 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                              ,0x86,"void DCFGReader::buildCFG(int)");
              }
              pCVar3 = CFGReader::haltNode(this_00);
              break;
            default:
              goto switchD_0010c108_caseD_3;
            case 5:
              CFGReader::markIndirect(local_c0);
            case 4:
            case 0x13:
              pCVar8 = CFGReader::instance(&local_b0->super_CFGReader,(Addr)addr);
              iVar5 = std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                              *)local_a8,&src_id);
              CFGReader::addCall(local_c0,pCVar8,(unsigned_long_long)count,iVar5._M_node == local_a0
                                );
              goto LAB_0010c0b1;
            case 6:
              pCVar3 = CFGReader::exitNode(this_00);
              break;
            case 0xd:
              pCVar3 = CFGReader::nodeWithAddr(this_00,(Addr)addr);
              CFG::addEdge(this_00,local_c0,pCVar3,(unsigned_long_long)count);
              pCVar3 = CFGReader::nodeWithAddr(this_00,(long)local_88->size + local_88->addr);
              count = (_List_node_base *)0x0;
LAB_0010c115:
              CFG::addEdge(this_00,local_c0,pCVar3,(unsigned_long_long)count);
              std::__cxx11::list<int,_std::allocator<int>_>::push_back
                        (&worklist,(value_type_conflict2 *)__k);
              goto LAB_0010c0b1;
            case 0x10:
              CFGReader::markIndirect(local_c0);
            case 7:
            case 0xf:
            case 0x11:
            case 0x12:
            case 0x15:
            case 0x19:
              pCVar3 = CFGReader::nodeWithAddr(this_00,(Addr)addr);
              goto LAB_0010c115;
            case 0x16:
              pCVar8 = CFGReader::instance(&local_b0->super_CFGReader,(Addr)addr);
              iVar5 = std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                              *)local_a8,&src_id);
              CFGReader::addSignalHandler
                        (local_c0,0,pCVar8,(unsigned_long_long)count,iVar5._M_node == local_a0);
              goto LAB_0010c0b1;
            }
            CFG::addEdge(this_00,local_c0,pCVar3,(unsigned_long_long)count);
          }
        } while( true );
      }
      __assertion = "src_node != 0 && src_node->type() == CfgNode::CFG_PHANTOM";
      __line = 0x5c;
      goto LAB_0010c2bb;
    }
    __assertion = "cfg->nodeByAddr(m_nodes[entry].addr) == 0";
    __line = 0x49;
  }
  else {
    __assertion = "cfg->entryNode() == 0";
    __line = 0x44;
  }
LAB_0010c2bb:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                ,__line,"void DCFGReader::buildCFG(int)");
LAB_0010c23a:
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>(local_a8,&src_id);
  this_02 = local_98;
  goto LAB_0010bff8;
}

Assistant:

void DCFGReader::buildCFG(int entry) {
	CFG* cfg = this->instance(m_nodes[entry].addr);

	// Add special entry node.
	assert(cfg->entryNode() == 0);
	CfgNode* entry_node = new CfgNode(CfgNode::CFG_ENTRY);
	cfg->addNode(entry_node);

	// Add the first node.
	assert(cfg->nodeByAddr(m_nodes[entry].addr) == 0);
	cfg->addEdge(entry_node, CFGReader::nodeWithAddr(cfg, m_nodes[entry].addr),
					cfg->execs());

	std::set<int> visited;
	std::list<int> worklist;
	worklist.push_back(entry);

	while (!worklist.empty()) {
		int src_id = worklist.front();
		worklist.pop_front();
		assert(src_id > 3);

		if (visited.find(src_id) != visited.cend())
			continue;
		visited.insert(src_id);

		DCFGReader::Node& src_bb = m_nodes[src_id];
		CfgNode* src_node = cfg->nodeByAddr(src_bb.addr);
		assert(src_node != 0 && src_node->type() == CfgNode::CFG_PHANTOM);
		src_node->setData(new CfgNode::BlockData(src_bb.addr, src_bb.size));

		for (DCFGReader::Edge& edge : m_edges[src_id]) {
			// Ignore unknown node.
			if (edge.dst_id == UNKNOWN_NODE)
				continue;

			std::map<int, Node>::const_iterator it = m_nodes.find(edge.dst_id);
			Addr dst_addr = (it != m_nodes.end() ? (it->second).addr : 0);

			unsigned long long count = edge.count;

			switch (edge.edge_type) {
				case INDIRECT_UNCONDITIONAL_BRANCH_EDGE:
					CFGReader::markIndirect(src_node);
					// fallthrough.
				case REP_EDGE:
				case CALL_BYPASS_EDGE:
				case SYSTEM_CALL_BYPASS_EDGE:
				case DIRECT_UNCONDITIONAL_BRANCH_EDGE:
				case FALL_THROUGH_EDGE:
				case EXCLUDED_CODE_BYPASS_EDGE:
					cfg->addEdge(src_node, CFGReader::nodeWithAddr(cfg, dst_addr), count);
					worklist.push_back(edge.dst_id);
					break;
				case DIRECT_CONDITIONAL_BRANCH_EDGE:
					cfg->addEdge(src_node, CFGReader::nodeWithAddr(cfg, dst_addr), count);
					cfg->addEdge(src_node, CFGReader::nodeWithAddr(cfg, src_bb.addr + src_bb.size));
					worklist.push_back(edge.dst_id);
					break;
				case INDIRECT_CALL_EDGE:
					CFGReader::markIndirect(src_node);
					// fallthrough
				case SYSTEM_CALL_EDGE:
				case DIRECT_CALL_EDGE: {
					CFG* called = this->instance(dst_addr);
					CFGReader::addCall(src_node, called, count,
						m_visited.find(src_id) == m_visited.cend());
					} break;
				case EXIT_EDGE:
					// The destination must be the special exit node (2).
					assert(edge.dst_id == 2);
					cfg->addEdge(src_node, CFGReader::haltNode(cfg), count);
					break;
				case RETURN_EDGE:
					cfg->addEdge(src_node, CFGReader::exitNode(cfg), count);
					break;
				case CONTEXT_CHANGE_EDGE: {
					CFG* sigHandler = this->instance(dst_addr);
					CFGReader::addSignalHandler(src_node, 0, sigHandler, count,
						m_visited.find(src_id) == m_visited.cend());

					} break;
				default: {
					// std::vector<std::string> edgeTypes = readStrings(obj, "EDGE_TYPES");
					// std::cout << "edge type: " << edgeTypes[edge.edge_type] << "\n";
					assert(false);
					} break;
			}
		}

		// Added to the global visited ids.
		m_visited.insert(src_id);
	}
}